

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O2

void __thiscall ObjectBlockPool<256,_256>::CollectUnmarked(ObjectBlockPool<256,_256> *this)

{
  MyLargeBlock *pMVar1;
  ulong uVar2;
  FastVector<SmallBlock<256>_*,_false,_false> *this_00;
  MyLargeBlock **ppMVar3;
  SmallBlock<256> *pSVar4;
  uint i;
  ulong uVar5;
  SmallBlock<256> *local_48;
  FastVector<SmallBlock<256>_*,_false,_false> *local_40;
  FastVector<SmallBlock<256>_*,_false,_false> *local_38;
  
  local_38 = &this->objectsToFree;
  local_40 = &this->objectsToFinalize;
  ppMVar3 = &this->activePages;
  while (pMVar1 = *ppMVar3, pMVar1 != (MyLargeBlock *)0x0) {
    pSVar4 = pMVar1->page;
    uVar5 = 0;
    while( true ) {
      uVar2 = (ulong)this->lastNum;
      if (pMVar1 != this->activePages) {
        uVar2 = 0x100;
      }
      if (uVar2 <= uVar5) break;
      if ((pSVar4->marker & 3) == 0) {
        this_00 = local_38;
        if (((uint)pSVar4->marker & 0xc) == 4) {
          this_00 = local_40;
        }
        local_48 = pSVar4;
        FastVector<SmallBlock<256>_*,_false,_false>::push_back(this_00,&local_48);
      }
      uVar5 = uVar5 + 1;
      pSVar4 = pSVar4 + 1;
    }
    ppMVar3 = &pMVar1->next;
  }
  return;
}

Assistant:

void CollectUnmarked()
	{
		for(MyLargeBlock *curr = activePages; curr; curr = curr->next)
		{
			for(unsigned int i = 0; i < (curr == activePages ? lastNum : countInBlock); i++)
			{
				markerType &marker = curr->page[i].marker;

				if(!(marker & (NULLC::OBJECT_VISIBLE | NULLC::OBJECT_FREED)))
				{
					if((marker & NULLC::OBJECT_FINALIZABLE) && !(marker & NULLC::OBJECT_FINALIZED))
					{
						objectsToFinalize.push_back(&curr->page[i]);
					}
					else
					{
						objectsToFree.push_back(&curr->page[i]);
					}
				}
			}
		}
	}